

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

void ITStatus_setITState(ARM_ITStatus *it,char Firstcond,char Mask)

{
  uint uVar1;
  undefined3 in_register_00000011;
  uint uVar2;
  uint uVar3;
  
  uVar2 = CONCAT31(in_register_00000011,Mask);
  if (uVar2 == 0) {
    uVar1 = 0x20;
  }
  else {
    uVar1 = 0;
    if (uVar2 != 0) {
      for (; (uVar2 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
      }
    }
  }
  if (uVar1 < 3) {
    uVar1 = uVar1 + 1;
    do {
      uVar3 = it->size;
      if (7 < it->size) {
        uVar3 = 0;
      }
      it->ITStates[uVar3] =
           ((uVar2 >> (uVar1 & 0x1f) & 1) != 0) != (bool)(Firstcond & 1U) ^ Firstcond & 0xfU;
      uVar3 = uVar3 + 1;
      it->size = uVar3;
      uVar1 = uVar1 + 1;
    } while (uVar1 != 4);
  }
  else {
    uVar3 = it->size;
  }
  uVar2 = 0;
  if (uVar3 < 8) {
    uVar2 = uVar3;
  }
  it->ITStates[uVar2] = Firstcond & 0xfU;
  it->size = uVar2 + 1;
  return;
}

Assistant:

static void ITStatus_setITState(ARM_ITStatus *it, char Firstcond, char Mask)
{
	// (3 - the number of trailing zeros) is the number of then / else.
	unsigned CondBit0 = Firstcond & 1;
	unsigned NumTZ = CountTrailingZeros_32(Mask);
	unsigned char CCBits = (unsigned char)Firstcond & 0xf;
	unsigned Pos;
	//assert(NumTZ <= 3 && "Invalid IT mask!");
	// push condition codes onto the stack the correct order for the pops
	for (Pos = NumTZ+1; Pos <= 3; ++Pos) {
		bool T = ((Mask >> Pos) & 1) == (int)CondBit0;
		if (T)
			ITStatus_push_back(it, CCBits);
		else
			ITStatus_push_back(it, CCBits ^ 1);
	}
	ITStatus_push_back(it, CCBits);
}